

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O0

void code_split_flag(H265eSlice *slice,RK_U32 abs_part_idx,RK_U32 depth,DataCu *cu)

{
  H265eSps *pHVar1;
  RK_U32 currSplitFlag;
  H265eCabacCtx *cabac_ctx;
  H265eSps *sps;
  DataCu *cu_local;
  RK_U32 depth_local;
  RK_U32 abs_part_idx_local;
  H265eSlice *slice_local;
  
  pHVar1 = slice->m_sps;
  if (depth != slice->m_sps->m_maxCUDepth - slice->m_sps->m_addCUDepth) {
    if ((h265e_debug & 0x800) != 0) {
      _mpp_log_l(4,"h265e_slice","depth %d cu->m_cuDepth %d",(char *)0x0,(ulong)depth,
                 (ulong)cu->m_cuDepth[pHVar1->zscan2raster[abs_part_idx]]);
    }
    h265e_cabac_encodeBin
              (&slice->m_cabac,slice->m_contextModels,
               (uint)(depth < cu->m_cuDepth[pHVar1->zscan2raster[abs_part_idx]]));
  }
  return;
}

Assistant:

static void code_split_flag(H265eSlice *slice, RK_U32 abs_part_idx, RK_U32 depth, DataCu *cu)
{
    H265eSps *sps = slice->m_sps;

    if (depth == slice->m_sps->m_maxCUDepth - slice->m_sps->m_addCUDepth)
        return;

    h265e_dbg_skip("depth %d cu->m_cuDepth %d", depth, cu->m_cuDepth[sps->zscan2raster[abs_part_idx]]);

    H265eCabacCtx *cabac_ctx = &slice->m_cabac;
    RK_U32 currSplitFlag = (cu->m_cuDepth[sps->zscan2raster[abs_part_idx]] > depth) ? 1 : 0;

    h265e_cabac_encodeBin(cabac_ctx, &slice->m_contextModels[OFF_SPLIT_FLAG_CTX], currSplitFlag);
}